

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O1

int Cec_ManSimClassesPrepare(Cec_ManSim_t *p,int LevelMax)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Gia_Rpr_t *pGVar3;
  int *piVar4;
  ulong uVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  size_t __size;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  
  pGVar6 = p->pAig;
  if (pGVar6->pReprs != (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pAig->pReprs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                  ,0x357,"int Cec_ManSimClassesPrepare(Cec_ManSim_t *, int)");
  }
  iVar10 = pGVar6->nObjs;
  pGVar3 = (Gia_Rpr_t *)calloc((long)iVar10,4);
  pGVar6->pReprs = pGVar3;
  piVar4 = (int *)calloc((long)iVar10,4);
  pGVar6->pNexts = piVar4;
  Gia_ManCreateValueRefs(pGVar6);
  if (p->pPars->fLatchCorr == 0) {
    pGVar6 = p->pAig;
    if (LevelMax == -1) {
      if (0 < pGVar6->nObjs) {
        lVar8 = 0;
        uVar5 = 0;
        do {
          if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
          uVar11 = *(uint *)(&pGVar6->pObjs->field_0x0 + lVar8);
          bVar13 = (~uVar11 & 0x1fffffff) != 0;
          uVar12 = 0;
          if (!bVar13 || -1 >= (int)uVar11) {
            uVar12 = 0xfffffff;
          }
          if (uVar5 <= uVar12 && (bVar13 && -1 < (int)uVar11)) goto LAB_0063d3a4;
          pGVar6->pReprs[uVar5] =
               (Gia_Rpr_t)((uint)pGVar6->pReprs[uVar5] & 0xf0000000 | (uint)uVar12);
          uVar5 = uVar5 + 1;
          pGVar6 = p->pAig;
          lVar8 = lVar8 + 0xc;
        } while ((long)uVar5 < (long)pGVar6->nObjs);
      }
    }
    else {
      Gia_ManLevelNum(pGVar6);
      pGVar6 = p->pAig;
      uVar5 = (ulong)(uint)pGVar6->nObjs;
      if (0 < pGVar6->nObjs) {
        uVar12 = 0;
        do {
          if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
          uVar11 = *(uint *)(pGVar6->pObjs + uVar12);
          uVar9 = 0xfffffff;
          if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
            if ((long)(int)uVar5 <= (long)uVar12) goto LAB_0063d3e2;
            pVVar2 = pGVar6->vLevels;
            if ((long)pVVar2->nSize <= (long)uVar12) {
              uVar5 = uVar12 + 1;
              lVar8 = (long)pVVar2->nCap;
              uVar9 = lVar8 * 2;
              if (SBORROW8(uVar12,uVar9) == (long)(uVar12 + lVar8 * -2) < 0) {
                if (lVar8 <= (long)uVar12) {
                  if (pVVar2->pArray == (int *)0x0) {
                    piVar4 = (int *)malloc(uVar5 * 4);
                  }
                  else {
                    piVar4 = (int *)realloc(pVVar2->pArray,uVar5 * 4);
                  }
                  pVVar2->pArray = piVar4;
                  if (piVar4 == (int *)0x0) goto LAB_0063d420;
                  uVar9 = uVar5 & 0xffffffff;
                  goto LAB_0063d0ef;
                }
              }
              else if (pVVar2->nCap < (int)uVar9 && lVar8 <= (long)uVar12) {
                __size = (long)(int)uVar9 << 2;
                if (pVVar2->pArray == (int *)0x0) {
                  piVar4 = (int *)malloc(__size);
                }
                else {
                  piVar4 = (int *)realloc(pVVar2->pArray,__size);
                }
                pVVar2->pArray = piVar4;
                if (piVar4 == (int *)0x0) {
LAB_0063d420:
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
LAB_0063d0ef:
                pVVar2->nCap = (int)uVar9;
              }
              iVar10 = pVVar2->nSize;
              if ((long)iVar10 <= (long)uVar12) {
                memset(pVVar2->pArray + iVar10,0,(ulong)(uint)((int)uVar12 - iVar10) * 4 + 4);
              }
              pVVar2->nSize = (int)uVar5;
            }
            if ((long)pVVar2->nSize <= (long)uVar12) goto LAB_0063d3c3;
            uVar9 = 0;
            if (LevelMax < pVVar2->pArray[uVar12]) {
              uVar9 = 0xfffffff;
            }
          }
          if (uVar12 <= uVar9 && (uint)uVar9 != 0xfffffff) goto LAB_0063d3a4;
          pGVar6->pReprs[uVar12] =
               (Gia_Rpr_t)((uint)pGVar6->pReprs[uVar12] & 0xf0000000 | (uint)uVar9);
          uVar12 = uVar12 + 1;
          pGVar6 = p->pAig;
          uVar5 = (ulong)pGVar6->nObjs;
        } while ((long)uVar12 < (long)uVar5);
      }
      if (pGVar6->vLevels != (Vec_Int_t *)0x0) {
        piVar4 = pGVar6->vLevels->pArray;
        if (piVar4 != (int *)0x0) {
          free(piVar4);
          pGVar6->vLevels->pArray = (int *)0x0;
        }
        if (pGVar6->vLevels != (Vec_Int_t *)0x0) {
          free(pGVar6->vLevels);
          pGVar6->vLevels = (Vec_Int_t *)0x0;
        }
      }
    }
  }
  else {
    pGVar6 = p->pAig;
    if (0 < pGVar6->nObjs) {
      lVar8 = 0;
      do {
        if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar6->pReprs[lVar8] = (Gia_Rpr_t)((uint)pGVar6->pReprs[lVar8] | 0xfffffff);
        lVar8 = lVar8 + 1;
        pGVar6 = p->pAig;
      } while (lVar8 < pGVar6->nObjs);
    }
  }
  if (p->pPars->fSeqSimulate != 0) {
    pGVar6 = p->pAig;
    iVar10 = pGVar6->nRegs;
    if (0 < iVar10) {
      iVar7 = 0;
      do {
        iVar1 = pGVar6->vCis->nSize;
        uVar11 = (iVar1 - iVar10) + iVar7;
        if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) {
LAB_0063d3c3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar10 = pGVar6->vCis->pArray[uVar11];
        lVar8 = (long)iVar10;
        if ((lVar8 < 0) || (pGVar6->nObjs <= iVar10)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
        if (pGVar6->pObjs[lVar8].Value != 0) {
          if (pGVar6->nObjs <= iVar10) {
LAB_0063d3e2:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          if (iVar10 == 0) {
LAB_0063d3a4:
            __assert_fail("Num == GIA_VOID || Num < Id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x400,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
          }
          pGVar6->pReprs[lVar8] = (Gia_Rpr_t)((uint)pGVar6->pReprs[lVar8] & 0xf0000000);
        }
        iVar7 = iVar7 + 1;
        pGVar6 = p->pAig;
        iVar10 = pGVar6->nRegs;
      } while (iVar7 < iVar10);
    }
  }
  p->nWords = 1;
  do {
    if (p->pPars->fVerbose != 0) {
      Gia_ManEquivPrintClasses
                (p->pAig,0,(float)(p->pPars->nWords + 1) * (float)p->nMemsMax * 9.536743e-07);
    }
    iVar10 = 4;
    do {
      Cec_ManSimCreateInfo(p,p->vCiSimInfo,p->vCoSimInfo);
      iVar7 = Cec_ManSimSimulateRound(p,p->vCiSimInfo,p->vCoSimInfo);
      if (iVar7 != 0) {
        return 1;
      }
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
    iVar10 = p->nWords;
    p->nWords = iVar10 * 2 + 1;
  } while (iVar10 * 2 < p->pPars->nWords);
  return 0;
}

Assistant:

int Cec_ManSimClassesPrepare( Cec_ManSim_t * p, int LevelMax )
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pAig->pReprs == NULL );
    // allocate representation
    p->pAig->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p->pAig) );
    p->pAig->pNexts = ABC_CALLOC( int, Gia_ManObjNum(p->pAig) );
    // create references
    Gia_ManCreateValueRefs( p->pAig );
    // set starting representative of internal nodes to be constant 0
    if ( p->pPars->fLatchCorr )
        Gia_ManForEachObj( p->pAig, pObj, i )
            Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
    else if ( LevelMax == -1 )
        Gia_ManForEachObj( p->pAig, pObj, i )
            Gia_ObjSetRepr( p->pAig, i, Gia_ObjIsAnd(pObj) ? 0 : GIA_VOID );
    else
    {
        Gia_ManLevelNum( p->pAig );
        Gia_ManForEachObj( p->pAig, pObj, i )
            Gia_ObjSetRepr( p->pAig, i, (Gia_ObjIsAnd(pObj) && Gia_ObjLevel(p->pAig,pObj) <= LevelMax) ? 0 : GIA_VOID );
        Vec_IntFreeP( &p->pAig->vLevels );
    }
    // if sequential simulation, set starting representative of ROs to be constant 0
    if ( p->pPars->fSeqSimulate )
        Gia_ManForEachRo( p->pAig, pObj, i )
            if ( pObj->Value )
                Gia_ObjSetRepr( p->pAig, Gia_ObjId(p->pAig, pObj), 0 );
    // perform simulation
    p->nWords = 1;
    do {
        if ( p->pPars->fVerbose )
            Gia_ManEquivPrintClasses( p->pAig, 0, Cec_MemUsage(p) );
        for ( i = 0; i < 4; i++ )
        {
            Cec_ManSimCreateInfo( p, p->vCiSimInfo, p->vCoSimInfo );
            if ( Cec_ManSimSimulateRound( p, p->vCiSimInfo, p->vCoSimInfo ) )
                return 1;
        }
        p->nWords = 2 * p->nWords + 1;
    }
    while ( p->nWords <= p->pPars->nWords );
    return 0;
}